

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.h
# Opt level: O1

ArrayIDIDFunc *
inverse_permutation<ArrayIDIDFunc>(ArrayIDIDFunc *__return_storage_ptr__,ArrayIDIDFunc *f)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  iVar1 = (f->super_ArrayIDFunc<int>).preimage_count_;
  lVar6 = (long)iVar1;
  (__return_storage_ptr__->super_ArrayIDFunc<int>).preimage_count_ = iVar1;
  if (lVar6 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar5 = lVar6 * 4;
    }
    piVar3 = (int *)operator_new__(uVar5);
  }
  (__return_storage_ptr__->super_ArrayIDFunc<int>).data_ = piVar3;
  __return_storage_ptr__->image_count_ = iVar1;
  if (0 < iVar1) {
    piVar3 = (f->super_ArrayIDFunc<int>).data_;
    piVar2 = (__return_storage_ptr__->super_ArrayIDFunc<int>).data_;
    lVar4 = 0;
    do {
      piVar2[piVar3[lVar4]] = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (lVar6 != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

ArrayIDIDFunc inverse_permutation(const IDIDFunc& f)
{
    assert(is_permutation(f));

    int id_count = f.preimage_count();

    ArrayIDIDFunc inv_f(id_count, id_count);
    for (int i = 0; i < id_count; ++i)
        inv_f[f(i)] = i;
    return inv_f; // NVRO
}